

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  byte bVar2;
  uint uVar3;
  UA_StatusCode UVar4;
  UA_DiagnosticInfo *pUVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = 0;
  do {
    pUVar1 = pos + 1;
    uVar7 = 0x80070000;
    if (end < pUVar1) {
LAB_001134c4:
      return uVar6 | uVar7;
    }
    bVar2 = *pos;
    uVar7 = 0;
    pos = pUVar1;
    if ((bVar2 & 1) != 0) {
      *(byte *)dst = *(byte *)dst | 1;
      uVar7 = 0x80070000;
      if (pos + 4 <= end) {
        dst->symbolicId = *(UA_Int32 *)pos;
        pos = pos + 4;
        uVar7 = 0;
      }
    }
    if ((bVar2 & 2) != 0) {
      *(byte *)dst = *(byte *)dst | 2;
      uVar3 = 0x80070000;
      if (pos + 4 <= end) {
        dst->namespaceUri = *(UA_Int32 *)pos;
        uVar3 = 0;
        pos = pos + 4;
      }
      uVar7 = uVar7 | uVar3;
    }
    if ((bVar2 & 4) != 0) {
      *(byte *)dst = *(byte *)dst | 4;
      uVar3 = 0x80070000;
      if (pos + 4 <= end) {
        dst->localizedText = *(UA_Int32 *)pos;
        uVar3 = 0;
        pos = pos + 4;
      }
      uVar7 = uVar7 | uVar3;
    }
    if ((bVar2 & 8) != 0) {
      *(byte *)dst = *(byte *)dst | 8;
      uVar3 = 0x80070000;
      if (pos + 4 <= end) {
        dst->locale = *(UA_Int32 *)pos;
        uVar3 = 0;
        pos = pos + 4;
      }
      uVar7 = uVar7 | uVar3;
    }
    if ((bVar2 & 0x10) != 0) {
      *(byte *)dst = *(byte *)dst | 0x10;
      UVar4 = Array_decodeBinary(&(dst->additionalInfo).data,&(dst->additionalInfo).length,
                                 UA_TYPES + 2);
      uVar7 = uVar7 | UVar4;
    }
    if ((bVar2 & 0x20) != 0) {
      *(byte *)dst = *(byte *)dst | 0x20;
      uVar3 = 0x80070000;
      if (pos + 4 <= end) {
        dst->innerStatusCode = *(UA_StatusCode *)pos;
        uVar3 = 0;
        pos = pos + 4;
      }
      uVar7 = uVar7 | uVar3;
    }
    if ((bVar2 & 0x40) == 0) goto LAB_001134c4;
    pUVar5 = (UA_DiagnosticInfo *)calloc(1,0x38);
    dst->innerDiagnosticInfo = pUVar5;
    if (pUVar5 == (UA_DiagnosticInfo *)0x0) {
      uVar7 = 0x80030000;
      goto LAB_001134c4;
    }
    *(byte *)dst = *(byte *)dst | 0x40;
    uVar6 = uVar6 | uVar7;
    dst = pUVar5;
  } while( true );
}

Assistant:

static UA_StatusCode
DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasSymbolicId = true;
        retval |= Int32_decodeBinary(&dst->symbolicId);
    }
    if(encodingMask & 0x02) {
        dst->hasNamespaceUri = true;
        retval |= Int32_decodeBinary(&dst->namespaceUri);
    }
    if(encodingMask & 0x04) {
        dst->hasLocalizedText = true;
        retval |= Int32_decodeBinary(&dst->localizedText);
    }
    if(encodingMask & 0x08) {
        dst->hasLocale = true;
        retval |= Int32_decodeBinary(&dst->locale);
    }
    if(encodingMask & 0x10) {
        dst->hasAdditionalInfo = true;
        retval |= String_decodeBinary(&dst->additionalInfo, NULL);
    }
    if(encodingMask & 0x20) {
        dst->hasInnerStatusCode = true;
        retval |= StatusCode_decodeBinary(&dst->innerStatusCode);
    }
    if(encodingMask & 0x40) {
        /* innerDiagnosticInfo is allocated on the heap */
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_calloc(1, sizeof(UA_DiagnosticInfo));
        if(!dst->innerDiagnosticInfo)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        dst->hasInnerDiagnosticInfo = true;
        retval |= DiagnosticInfo_decodeBinary(dst->innerDiagnosticInfo, NULL);
    }
    return retval;
}